

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O1

Am_Drawonable * Am_Drawonable::Get_Root_Drawonable(char *screen)

{
  bool bVar1;
  Am_Drawonable *draw;
  Display *new_display;
  Am_Drawonable *local_18;
  Display *local_10;
  
  bVar1 = Screen_Manager::Get(&Scrn_Mgr,screen,&local_10,&local_18);
  if (!bVar1) {
    local_10 = (Display *)XOpenDisplay(screen);
    if (local_10 == (Display *)0x0) {
      Am_Error("** Couldn\'t open display.\n");
    }
    local_18 = make_root_drawonable(screen,local_10);
  }
  return local_18;
}

Assistant:

Am_Drawonable *
Am_Drawonable::Get_Root_Drawonable(const char *screen)
{

  // if this screen's root drawonable has already been requested, just
  // return it
  Display *new_display;
  Am_Drawonable *draw;
  if (Scrn_Mgr.Get(screen, new_display, draw))
    return draw;
  new_display = XOpenDisplay(screen);
  if (!new_display)
    Am_Error("** Couldn't open display.\n");

  // DEBUGGING STUFF IN X
  // This should be commented out most of the time.
  // If you start getting X errors and want to debug them quickly,
  // uncomment these lines and run your program again.  This will cause
  // X to crash through our own error handler, at the correct error location,
  // instead of crashing sometime randomly after the error occurs.  Also, the
  // stack is preserved, which is very useful.
  // SYNCHRONOUS DRAWING IS VERY SLOW.  It should NOT be turned on except
  // when debugging!
  // af1x 5-21-96  Uncomment the following 2 lines to easily debug in X
  // XSynchronize(new_display, 1);  // turn on synchronous drawing calls
  // XSetErrorHandler(amulet_x_error); // use our error handler to preserve stack

  draw = make_root_drawonable(screen, new_display);
  return draw;
}